

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.c
# Opt level: O2

void ZydisFormatterBufferInitTokenized
               (ZydisFormatterBuffer *buffer,ZydisFormatterToken **first_token,void *user_buffer,
               ZyanUSize length)

{
  uint __line;
  char *__assertion;
  
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assertion = "buffer";
    __line = 0x53;
  }
  else if (first_token == (ZydisFormatterToken **)0x0) {
    __assertion = "first_token";
    __line = 0x54;
  }
  else if (user_buffer == (void *)0x0) {
    __assertion = "user_buffer";
    __line = 0x55;
  }
  else {
    if (length != 0) {
      *first_token = (ZydisFormatterToken *)user_buffer;
      *(undefined2 *)user_buffer = 0;
      buffer->is_token_list = '\x01';
      buffer->capacity = length - 2;
      (buffer->string).flags = '\x01';
      (buffer->string).vector.allocator = (ZyanAllocator *)0x0;
      (buffer->string).vector.growth_factor = '\x01';
      (buffer->string).vector.shrink_threshold = '\0';
      (buffer->string).vector.destructor = (ZyanMemberProcedure)0x0;
      (buffer->string).vector.element_size = 1;
      (buffer->string).vector.size = 1;
      (buffer->string).vector.capacity = length - 2;
      (buffer->string).vector.data = (void *)((long)user_buffer + 2);
      *(undefined1 *)((long)user_buffer + 2) = 0;
      return;
    }
    __assertion = "length";
    __line = 0x56;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                ,__line,
                "void ZydisFormatterBufferInitTokenized(ZydisFormatterBuffer *, ZydisFormatterToken **, void *, ZyanUSize)"
               );
}

Assistant:

static void ZydisFormatterBufferInitTokenized(ZydisFormatterBuffer* buffer,
    ZydisFormatterToken** first_token, void* user_buffer, ZyanUSize length)
{
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(first_token);
    ZYAN_ASSERT(user_buffer);
    ZYAN_ASSERT(length);

    *first_token = user_buffer;
    (*first_token)->type = ZYDIS_TOKEN_INVALID;
    (*first_token)->next = 0;

    user_buffer = (ZyanU8*)user_buffer + sizeof(ZydisFormatterToken);
    length -= sizeof(ZydisFormatterToken);

    buffer->is_token_list                  = ZYAN_TRUE;
    buffer->capacity                       = length;
    buffer->string.flags                   = ZYAN_STRING_HAS_FIXED_CAPACITY;
    buffer->string.vector.allocator        = ZYAN_NULL;
    buffer->string.vector.growth_factor    = 1;
    buffer->string.vector.shrink_threshold = 0;
    buffer->string.vector.destructor       = ZYAN_NULL;
    buffer->string.vector.element_size     = sizeof(char);
    buffer->string.vector.size             = 1;
    buffer->string.vector.capacity         = length;
    buffer->string.vector.data             = user_buffer;

    *(char*)user_buffer = '\0';
}